

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter_enc.c
# Opt level: O0

void av1_build_inter_predictors_for_planes_single_buf
               (MACROBLOCKD *xd,BLOCK_SIZE bsize,int plane_from,int plane_to,int ref,
               uint8_t **ext_dst,int *ext_dst_stride)

{
  uint uVar1;
  int_interpfilters interp_filters;
  int iVar2;
  int in_ECX;
  int in_EDX;
  BLOCK_SIZE in_SIL;
  MACROBLOCKD *in_RDI;
  int in_R8D;
  long in_R9;
  MV mv;
  uint8_t *dst;
  InterPredParams inter_pred_params;
  int bh;
  int bw;
  BLOCK_SIZE plane_bsize;
  macroblockd_plane *pd;
  int plane;
  WarpedMotionParams *wm;
  WarpTypesAllowed warp_types;
  int mi_y;
  int mi_x;
  int mi_col;
  int mi_row;
  MB_MODE_INFO *mi;
  int iVar3;
  undefined4 in_stack_fffffffffffffe0c;
  int iVar4;
  int in_stack_fffffffffffffe14;
  int in_stack_fffffffffffffe1c;
  int plane_00;
  int in_stack_fffffffffffffe24;
  int in_stack_fffffffffffffe3c;
  undefined4 in_stack_fffffffffffffe40;
  int in_stack_fffffffffffffe60;
  int bit_depth;
  uint8_t *in_stack_fffffffffffffe68;
  int in_stack_fffffffffffffe70;
  int in_stack_fffffffffffffe78;
  scale_factors *in_stack_fffffffffffffe80;
  buf_2d *in_stack_fffffffffffffe88;
  undefined1 auStack_130 [172];
  uint local_84;
  uint local_80;
  BLOCK_SIZE local_79;
  macroblockd_plane *local_78;
  int local_6c;
  WarpedMotionParams *local_68;
  int local_60;
  uint local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  MB_MODE_INFO *local_48;
  long local_40;
  int local_38;
  int local_34;
  int local_30;
  BLOCK_SIZE local_29;
  MACROBLOCKD *local_28;
  
  local_48 = *in_RDI->mi;
  local_4c = in_RDI->mi_row;
  local_50 = in_RDI->mi_col;
  local_54 = local_50 << 2;
  local_58 = local_4c << 2;
  local_68 = in_RDI->global_motion + local_48->ref_frame[in_R8D];
  local_40 = in_R9;
  local_38 = in_R8D;
  local_34 = in_ECX;
  local_30 = in_EDX;
  local_29 = in_SIL;
  local_28 = in_RDI;
  local_60 = is_global_mv_block(local_48,local_68->wmtype);
  local_5c = (uint)(local_48->motion_mode == '\x02');
  for (local_6c = local_30; bit_depth = (int)in_stack_fffffffffffffe68, local_6c <= local_34;
      local_6c = local_6c + 1) {
    local_78 = local_28->plane + local_6c;
    local_79 = get_plane_block_size(local_29,local_78->subsampling_x,local_78->subsampling_y);
    uVar1 = (uint)block_size_wide[local_79];
    local_84 = (uint)block_size_high[local_79];
    interp_filters.as_int = local_58 >> ((byte)local_78->subsampling_y & 0x1f);
    iVar3 = local_78->subsampling_y;
    iVar4 = local_28->bd;
    local_80 = uVar1;
    iVar2 = is_cur_buf_hbd(local_28);
    plane_00 = 0;
    av1_init_inter_params
              ((InterPredParams *)CONCAT44(uVar1,in_stack_fffffffffffffe40),
               in_stack_fffffffffffffe3c,(local_48->interp_filters).as_int,
               (int)((ulong)(local_78->pre + local_38) >> 0x20),(int)(local_78->pre + local_38),
               (int)((ulong)local_28->block_ref_scale_factors[local_38] >> 0x20),
               in_stack_fffffffffffffe60,bit_depth,in_stack_fffffffffffffe70,
               in_stack_fffffffffffffe78,in_stack_fffffffffffffe80,in_stack_fffffffffffffe88,
               interp_filters);
    get_conv_params(in_stack_fffffffffffffe24,plane_00,in_stack_fffffffffffffe1c);
    memcpy(auStack_130,&stack0xfffffffffffffe70,0x30);
    av1_init_warp_params
              ((InterPredParams *)CONCAT44(in_stack_fffffffffffffe24,plane_00),
               (WarpTypesAllowed *)CONCAT44(in_stack_fffffffffffffe1c,iVar2),
               in_stack_fffffffffffffe14,(MACROBLOCKD *)CONCAT44(in_stack_fffffffffffffe0c,iVar3),
               (MB_MODE_INFO *)0x2f3a98);
    in_stack_fffffffffffffe68 = get_buf_by_bd(local_28,*(uint8_t **)(local_40 + (long)local_6c * 8))
    ;
    av1_enc_build_one_inter_predictor
              ((uint8_t *)CONCAT44(in_stack_fffffffffffffe24,plane_00),in_stack_fffffffffffffe1c,
               (MV *)CONCAT44(in_stack_fffffffffffffe14,iVar4),
               (InterPredParams *)CONCAT44(in_stack_fffffffffffffe0c,iVar3));
  }
  return;
}

Assistant:

void av1_build_inter_predictors_for_planes_single_buf(
    MACROBLOCKD *xd, BLOCK_SIZE bsize, int plane_from, int plane_to, int ref,
    uint8_t *ext_dst[], int ext_dst_stride[]) {
  assert(bsize < BLOCK_SIZES_ALL);
  const MB_MODE_INFO *mi = xd->mi[0];
  const int mi_row = xd->mi_row;
  const int mi_col = xd->mi_col;
  const int mi_x = mi_col * MI_SIZE;
  const int mi_y = mi_row * MI_SIZE;
  WarpTypesAllowed warp_types;
  const WarpedMotionParams *const wm = &xd->global_motion[mi->ref_frame[ref]];
  warp_types.global_warp_allowed = is_global_mv_block(mi, wm->wmtype);
  warp_types.local_warp_allowed = mi->motion_mode == WARPED_CAUSAL;

  for (int plane = plane_from; plane <= plane_to; ++plane) {
    const struct macroblockd_plane *pd = &xd->plane[plane];
    const BLOCK_SIZE plane_bsize =
        get_plane_block_size(bsize, pd->subsampling_x, pd->subsampling_y);
    const int bw = block_size_wide[plane_bsize];
    const int bh = block_size_high[plane_bsize];

    InterPredParams inter_pred_params;

    av1_init_inter_params(&inter_pred_params, bw, bh, mi_y >> pd->subsampling_y,
                          mi_x >> pd->subsampling_x, pd->subsampling_x,
                          pd->subsampling_y, xd->bd, is_cur_buf_hbd(xd), 0,
                          xd->block_ref_scale_factors[ref], &pd->pre[ref],
                          mi->interp_filters);
    inter_pred_params.conv_params = get_conv_params(0, plane, xd->bd);
    av1_init_warp_params(&inter_pred_params, &warp_types, ref, xd, mi);

    uint8_t *const dst = get_buf_by_bd(xd, ext_dst[plane]);
    const MV mv = mi->mv[ref].as_mv;

    av1_enc_build_one_inter_predictor(dst, ext_dst_stride[plane], &mv,
                                      &inter_pred_params);
  }
}